

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_event.h
# Opt level: O0

int __thiscall
miniros::MessageEvent<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>::init
          (MessageEvent<const_rosgraph_msgs::Clock_<std::allocator<void>_>_> *this,EVP_PKEY_CTX *ctx
          )

{
  function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()> *pfVar1;
  TimeBase<miniros::Time,_miniros::Duration> in_RCX;
  byte in_R8B;
  shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_> *in_R9;
  MessageEvent<const_rosgraph_msgs::Clock_<std::allocator<void>_>_> *this_00;
  
  this_00 = this;
  std::shared_ptr<const_rosgraph_msgs::Clock_<std::allocator<void>_>_>::operator=
            (in_R9,&this->message_);
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=((shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_R9,(shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)this);
  (this->receipt_time_).super_TimeBase<miniros::Time,_miniros::Duration> = in_RCX;
  this->nonconst_need_copy_ = (bool)(in_R8B & 1);
  pfVar1 = std::function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>::
           operator=((function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()> *)
                     this_00,(function<std::shared_ptr<rosgraph_msgs::Clock_<std::allocator<void>_>_>_()>
                              *)ctx);
  return (int)pfVar1;
}

Assistant:

void init(const ConstMessagePtr& message, const std::shared_ptr<M_string>& connection_header, Time receipt_time, bool nonconst_need_copy, const CreateFunction& create)
  {
    message_ = message;
    connection_header_ = connection_header;
    receipt_time_ = receipt_time;
    nonconst_need_copy_ = nonconst_need_copy;
    create_ = create;
  }